

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_consumer.c
# Opt level: O1

amqp_rpc_reply_t *
amqp_consume_message
          (amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
          amqp_envelope_t *envelope,timeval *timeout,int flags)

{
  int iVar1;
  amqp_bytes_t aVar2;
  amqp_frame_t frame;
  amqp_frame_t local_50;
  
  (__return_storage_ptr__->reply).decoded = (void *)0x0;
  *(undefined8 *)&__return_storage_ptr__->library_error = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)&__return_storage_ptr__->reply = 0;
  memset(envelope,0,0x160);
  iVar1 = amqp_simple_wait_frame_noblock(state,&local_50,timeout);
  if (iVar1 == 0) {
    if ((local_50.frame_type == '\x01') && (local_50.payload.method.id == 0x3c003c)) {
      envelope->channel = local_50.channel;
      aVar2 = amqp_bytes_malloc_dup(*local_50.payload.method.decoded);
      envelope->consumer_tag = aVar2;
      envelope->delivery_tag = ((amqp_bytes_t *)(local_50.payload.properties.body_size + 0x10))->len
      ;
      envelope->redelivered = *(amqp_boolean_t *)(local_50.payload.properties.body_size + 0x18);
      aVar2 = amqp_bytes_malloc_dup(*(amqp_bytes_t *)(local_50.payload.properties.body_size + 0x20))
      ;
      envelope->exchange = aVar2;
      aVar2 = amqp_bytes_malloc_dup(*(amqp_bytes_t *)(local_50.payload.properties.body_size + 0x30))
      ;
      envelope->routing_key = aVar2;
      if (((((envelope->consumer_tag).len == 0) || ((envelope->consumer_tag).bytes != (void *)0x0))
          && (((envelope->exchange).len == 0 || ((envelope->exchange).bytes != (void *)0x0)))) &&
         (aVar2.bytes != (void *)0x0 || aVar2.len == 0)) {
        amqp_read_message(__return_storage_ptr__,state,envelope->channel,&envelope->message,flags);
        if (__return_storage_ptr__->reply_type == AMQP_RESPONSE_NORMAL) {
          __return_storage_ptr__->reply_type = AMQP_RESPONSE_NORMAL;
          return __return_storage_ptr__;
        }
      }
      else {
        __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
        __return_storage_ptr__->library_error = -1;
      }
      amqp_bytes_free(envelope->routing_key);
      amqp_bytes_free(envelope->exchange);
      amqp_bytes_free(envelope->consumer_tag);
    }
    else {
      amqp_put_back_frame(state,&local_50);
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      __return_storage_ptr__->library_error = -0x10;
    }
  }
  else {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t
amqp_consume_message(amqp_connection_state_t state, amqp_envelope_t *envelope,
                     struct timeval *timeout, AMQP_UNUSED int flags)
{
  int res;
  amqp_frame_t frame;
  amqp_basic_deliver_t *delivery_method;
  amqp_rpc_reply_t ret;

  memset(&ret, 0, sizeof(amqp_rpc_reply_t));
  memset(envelope, 0, sizeof(amqp_envelope_t));

  res = amqp_simple_wait_frame_noblock(state, &frame, timeout);
  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    goto error_out1;
  }

  if (AMQP_FRAME_METHOD != frame.frame_type
      || AMQP_BASIC_DELIVER_METHOD != frame.payload.method.id) {
    amqp_put_back_frame(state, &frame);
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;
    goto error_out1;
  }

  delivery_method = frame.payload.method.decoded;

  envelope->channel = frame.channel;
  envelope->consumer_tag = amqp_bytes_malloc_dup(delivery_method->consumer_tag);
  envelope->delivery_tag = delivery_method->delivery_tag;
  envelope->redelivered = delivery_method->redelivered;
  envelope->exchange = amqp_bytes_malloc_dup(delivery_method->exchange);
  envelope->routing_key = amqp_bytes_malloc_dup(delivery_method->routing_key);

  if (amqp_bytes_malloc_dup_failed(envelope->consumer_tag) ||
      amqp_bytes_malloc_dup_failed(envelope->exchange) ||
      amqp_bytes_malloc_dup_failed(envelope->routing_key)) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_NO_MEMORY;
    goto error_out2;
  }

  ret = amqp_read_message(state, envelope->channel, &envelope->message, 0);
  if (AMQP_RESPONSE_NORMAL != ret.reply_type) {
    goto error_out2;
  }

  ret.reply_type = AMQP_RESPONSE_NORMAL;
  return ret;

error_out2:
  amqp_bytes_free(envelope->routing_key);
  amqp_bytes_free(envelope->exchange);
  amqp_bytes_free(envelope->consumer_tag);
error_out1:
  return ret;
}